

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

int xmlParserInputGrow(xmlParserInputPtr in,int len)

{
  xmlBufPtr buf;
  int iVar1;
  size_t sVar2;
  xmlChar *pxVar3;
  long lVar4;
  
  iVar1 = -1;
  if ((((-1 < len && in != (xmlParserInputPtr)0x0) && (in->buf != (xmlParserInputBufferPtr)0x0)) &&
      (in->base != (xmlChar *)0x0)) &&
     ((in->cur != (xmlChar *)0x0 && (buf = in->buf->buffer, buf != (xmlBufPtr)0x0)))) {
    lVar4 = (long)in->cur - (long)in->base;
    sVar2 = xmlBufUse(buf);
    iVar1 = 0;
    if ((sVar2 <= (int)lVar4 + 0xfa) &&
       (iVar1 = 0, in->buf->readcallback != (xmlInputReadCallback)0x0)) {
      iVar1 = xmlParserInputBufferGrow(in->buf,len);
      pxVar3 = xmlBufContent(in->buf->buffer);
      in->base = pxVar3;
      in->cur = pxVar3 + lVar4;
      pxVar3 = xmlBufEnd(in->buf->buffer);
      in->end = pxVar3;
    }
  }
  return iVar1;
}

Assistant:

int
xmlParserInputGrow(xmlParserInputPtr in, int len) {
    int ret;
    size_t indx;

    if ((in == NULL) || (len < 0)) return(-1);
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext, "Grow\n");
#endif
    if (in->buf == NULL) return(-1);
    if (in->base == NULL) return(-1);
    if (in->cur == NULL) return(-1);
    if (in->buf->buffer == NULL) return(-1);

    CHECK_BUFFER(in);

    indx = in->cur - in->base;
    if (xmlBufUse(in->buf->buffer) > (unsigned int) indx + INPUT_CHUNK) {

	CHECK_BUFFER(in);

        return(0);
    }
    if (in->buf->readcallback != NULL) {
	ret = xmlParserInputBufferGrow(in->buf, len);
    } else
        return(0);

    in->base = xmlBufContent(in->buf->buffer);
    in->cur = in->base + indx;
    in->end = xmlBufEnd(in->buf->buffer);

    CHECK_BUFFER(in);

    return(ret);
}